

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
NoiseModelUpdateTest<BitDepthParams<unsigned_short,_8,_true>_>::SetUp
          (NoiseModelUpdateTest<BitDepthParams<unsigned_short,_8,_true>_> *this)

{
  aom_noise_model_params_t params_00;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  int *in_RDI;
  int offset;
  int c;
  AssertionResult gtest_ar_;
  aom_noise_model_params_t params;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_88;
  char *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  Type in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar5;
  char *in_stack_ffffffffffffffd8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffe0;
  AssertionResult *assertion_result;
  AssertHelper *this_00;
  
  assertion_result = (AssertionResult *)0x300000001;
  this_00 = (AssertHelper *)0x100000008;
  uVar5 = 1;
  params_00.lag = in_stack_ffffffffffffff98;
  params_00._0_4_ = in_stack_ffffffffffffff94;
  params_00.bit_depth = in_stack_ffffffffffffff9c;
  params_00.use_highbd = in_stack_ffffffffffffffa0;
  iVar2 = aom_noise_model_init
                    ((aom_noise_model_t *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),params_00);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_RDI
             ,(type *)0x5c170d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffd8);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (assertion_result,(char *)in_stack_ffffffffffffffe0._M_head_impl,
               in_stack_ffffffffffffffd8,(char *)CONCAT44(iVar2,uVar5));
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c,
               (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80);
    testing::internal::AssertHelper::operator=(this_00,(Message *)assertion_result);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
    testing::Message::~Message((Message *)0x5c17ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5c182d);
  if (bVar1) {
    libaom_test::ACMRandom::Reset
              ((ACMRandom *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (int)((ulong)in_RDI >> 0x20));
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    iVar2 = 0;
    for (local_88 = 0; local_88 < 3; local_88 = local_88 + 1) {
      pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0xb4)
                          ,(long)iVar2);
      *(reference *)(in_RDI + (long)local_88 * 2 + 0xd2) = pvVar3;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xc0),(long)iVar2);
      *(reference *)(in_RDI + (long)local_88 * 2 + 0xde) = pvVar4;
      pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0xba)
                          ,(long)iVar2);
      *(reference *)(in_RDI + (long)local_88 * 2 + 0xd8) = pvVar3;
      in_RDI[(long)local_88 + 0xe4] = 0x80;
      pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0xb4)
                          ,(long)iVar2);
      *(reference *)(in_RDI + (long)local_88 * 2 + 0xea) = pvVar3;
      pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 0xba)
                          ,(long)iVar2);
      *(reference *)(in_RDI + (long)local_88 * 2 + 0xf0) = pvVar3;
      iVar2 = iVar2 + 0x4000;
    }
    in_RDI[0xe7] = 0;
    in_RDI[0xe8] = 0;
  }
  return;
}

Assistant:

void SetUp() override {
    const aom_noise_model_params_t params = { AOM_NOISE_SHAPE_SQUARE, 3,
                                              T::kBitDepth, T::kUseHighBD };
    ASSERT_TRUE(aom_noise_model_init(&model_, params));

    random_.Reset(100171);

    data_.resize(kWidth * kHeight * 3);
    denoised_.resize(kWidth * kHeight * 3);
    noise_.resize(kWidth * kHeight * 3);
    renoise_.resize(kWidth * kHeight);
    flat_blocks_.resize(kNumBlocksX * kNumBlocksY);

    for (int c = 0, offset = 0; c < 3; ++c, offset += kWidth * kHeight) {
      data_ptr_[c] = &data_[offset];
      noise_ptr_[c] = &noise_[offset];
      denoised_ptr_[c] = &denoised_[offset];
      strides_[c] = kWidth;

      data_ptr_raw_[c] = (uint8_t *)&data_[offset];
      denoised_ptr_raw_[c] = (uint8_t *)&denoised_[offset];
    }
    chroma_sub_[0] = 0;
    chroma_sub_[1] = 0;
  }